

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_cacheflush(sqlite3 *db)

{
  Btree *pBVar1;
  Pager *p;
  bool bVar2;
  int iVar3;
  PgHdr *pPVar4;
  int iVar5;
  long lVar6;
  PgHdr *pPg;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  bVar2 = false;
  iVar5 = 0;
  for (lVar6 = 0; (iVar5 == 0 && (lVar6 < db->nDb)); lVar6 = lVar6 + 1) {
    pBVar1 = db->aDb[lVar6].pBt;
    iVar5 = 0;
    if ((pBVar1 != (Btree *)0x0) && (pBVar1->inTrans == '\x02')) {
      p = pBVar1->pBt->pPager;
      iVar5 = p->errCode;
      if (p->memDb == '\0') {
        pPVar4 = sqlite3PcacheDirtyList(p->pPCache);
        while ((pPg = pPVar4, iVar5 == 0 && (pPg != (PgHdr *)0x0))) {
          pPVar4 = pPg->pDirty;
          iVar5 = 0;
          if (pPg->nRef == 0) {
            iVar5 = pagerStress(p,pPg);
          }
        }
      }
      if (iVar5 == 5) {
        bVar2 = true;
        iVar5 = 0;
      }
    }
  }
  sqlite3BtreeLeaveAll(db);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  iVar3 = 5;
  if (!bVar2) {
    iVar3 = iVar5;
  }
  if (iVar5 != 0) {
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_db_cacheflush(sqlite3 *db){
  int i;
  int rc = SQLITE_OK;
  int bSeenBusy = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt && sqlite3BtreeIsInTrans(pBt) ){
      Pager *pPager = sqlite3BtreePager(pBt);
      rc = sqlite3PagerFlush(pPager);
      if( rc==SQLITE_BUSY ){
        bSeenBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return ((rc==SQLITE_OK && bSeenBusy) ? SQLITE_BUSY : rc);
}